

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O1

void printrowsz(int vulnerability_id,FILE *finx,longlong size,longlong uncompressedSize)

{
  pointer puVar1;
  int iVar2;
  undefined8 extraout_RAX;
  ulong uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressedBuffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressedBuffer;
  uLongf destLen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  long local_30;
  
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_48,size + 1);
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_68,uncompressedSize);
  fread(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start,size,1,(FILE *)finx);
  local_30 = (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  iVar2 = uncompress(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,&local_30,
                     local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,size);
  puVar1 = local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (iVar2 == 0) {
    if (uncompressedSize != 0) {
      uVar3 = 0;
      do {
        printf("%d, %d, %d, %.10e\n",SUB84((double)*(float *)(puVar1 + uVar3 + 8),0),
               vulnerability_id,(ulong)*(uint *)(puVar1 + uVar3),
               (ulong)*(uint *)(puVar1 + uVar3 + 4));
        uVar3 = uVar3 + 0xc;
      } while (uVar3 < (ulong)uncompressedSize);
    }
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  printrowsz();
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

inline void printrowsz(int vulnerability_id, FILE *finx, long long size,
		       long long uncompressedSize) {

	uLongf i = 0;
	std::vector<unsigned char> compressedBuffer;
	compressedBuffer.resize(size + 1);

	std::vector<unsigned char> uncompressedBuffer;
	uncompressedBuffer.resize(uncompressedSize);

	fread(&compressedBuffer[0], size, 1, finx);
	uLongf destLen = (uLongf)uncompressedBuffer.size();
	int ret = uncompress(&uncompressedBuffer[0], &destLen,
			     &compressedBuffer[0], size);
	if (ret != Z_OK) {
		fprintf(stderr, "FATAL: Got bad return code from uncompress %d\n", ret);
		exit(EXIT_FAILURE);
	}

	VulnerabilityRow *row = (VulnerabilityRow*)&uncompressedBuffer[0];
	while (i < uncompressedSize) {
		printf("%d, %d, %d, %.10e\n", vulnerability_id,
		       row->intensity_bin_id, row->damage_bin_id,
		       row->probability);
		row++;
		i += sizeof(VulnerabilityRow);
	}

}